

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O0

int fits_unshuffle_2bytes(char *heap,LONGLONG length,int *status)

{
  void *__src;
  char *local_40;
  char *heapptr;
  char *cptr;
  char *ptr;
  LONGLONG ii;
  int *status_local;
  LONGLONG length_local;
  char *heap_local;
  
  __src = malloc(length << 1);
  local_40 = heap + length * 2;
  heapptr = (char *)((long)__src + length * 2 + -1);
  for (ptr = (char *)0x0; local_40 = local_40 + -1, (long)ptr < length; ptr = ptr + 1) {
    *heapptr = *local_40;
    heapptr[-1] = local_40[-length];
    heapptr = heapptr + -2;
  }
  memcpy(heap,__src,length << 1);
  free(__src);
  return *status;
}

Assistant:

static int fits_unshuffle_2bytes(char *heap, LONGLONG length, int *status)

/* unshuffle the bytes in an array of 2-byte integers */

{
    LONGLONG ii;
    char *ptr, *cptr, *heapptr;
    
    ptr = malloc((size_t) (length * 2));
    heapptr = heap + (2 * length) - 1;
    cptr = ptr + (2 * length) - 1;
    
    for (ii = 0; ii < length; ii++) {
       *cptr = *heapptr;
       cptr--;
       *cptr = *(heapptr - length);
       cptr--;
       heapptr--;
    }
         
    memcpy(heap, ptr, (size_t) (length * 2));
    free(ptr);
    return(*status);
}